

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

string * __thiscall
pbrt::ImageMetadata::ToString_abi_cxx11_(string *__return_storage_ptr__,ImageMetadata *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pstd::optional<float>const&,pstd::optional<pbrt::SquareMatrix<4>>const&,pstd::optional<pbrt::SquareMatrix<4>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,pstd::optional<int>const&,pstd::optional<float>const&,pstd::optional<pbrt::RGBColorSpace_const*>const&>
            (__return_storage_ptr__,
             "[ ImageMetadata renderTimeSeconds: %s cameraFromWorld: %s NDCFromWorld: %s pixelBounds: %s fullResolution: %s samplesPerPixel: %s MSE: %s colorSpace: %s ]"
             ,&this->renderTimeSeconds,&this->cameraFromWorld,&this->NDCFromWorld,&this->pixelBounds
             ,&this->fullResolution,&this->samplesPerPixel,&this->MSE,&this->colorSpace);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageMetadata::ToString() const {
    return StringPrintf("[ ImageMetadata renderTimeSeconds: %s cameraFromWorld: %s "
                        "NDCFromWorld: %s pixelBounds: %s fullResolution: %s "
                        "samplesPerPixel: %s MSE: %s colorSpace: %s ]",
                        renderTimeSeconds, cameraFromWorld, NDCFromWorld, pixelBounds,
                        fullResolution, samplesPerPixel, MSE, colorSpace);
}